

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

intptr_t ArrayAddEx(array *p,size_t Count,size_t Width,void *Data,arraycmp Cmp,void *CmpParam,
                   size_t Align)

{
  bool_t bVar1;
  long local_50;
  bool_t Found;
  intptr_t Pos;
  void *CmpParam_local;
  arraycmp Cmp_local;
  void *Data_local;
  size_t Width_local;
  size_t Count_local;
  array *p_local;
  
  Pos = (intptr_t)CmpParam;
  CmpParam_local = Cmp;
  Cmp_local = (arraycmp)Data;
  Data_local = (void *)Width;
  Width_local = Count;
  Count_local = (size_t)p;
  Found = ArrayFindEx(p,Count,Width,Data,Cmp,CmpParam,&local_50);
  if (local_50 == 0) {
    bVar1 = ArrayInsert((array *)Count_local,(long)Data_local * Found,Cmp_local,(size_t)Data_local,
                        Align);
    if (bVar1 == 0) {
      return -1;
    }
  }
  else {
    if (Count_local == 0) {
      __assert_fail("&(*p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0x204,
                    "intptr_t ArrayAddEx(array *, size_t, size_t, const void *, arraycmp, const void *, size_t)"
                   );
    }
    memcpy((void *)(*(long *)Count_local + (long)Data_local * Found),Cmp_local,(size_t)Data_local);
  }
  return Found;
}

Assistant:

intptr_t ArrayAddEx(array* p,size_t Count, size_t Width, const void* Data, arraycmp Cmp, const void* CmpParam, size_t Align)
{
    intptr_t Pos;
    bool_t Found;

    Pos = ArrayFindEx(p,Count,Width,Data,Cmp,CmpParam,&Found);
    if (!Found)
    {
        if (!ArrayInsert(p,Width*Pos,Data,Width,Align))
            return -1;
    }
    else
        memcpy(ARRAYBEGIN(*p,uint8_t) + Width*Pos, Data, Width);

    return Pos;
}